

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprite.cpp
# Opt level: O2

void __thiscall
piksel::Sprite::draw
          (Sprite *this,Graphics *g,float dx,float dy,float dWidth,float dHeight,
          bool flipHorizontally,bool flipVertically,bool flipDiagonally)

{
  float fVar1;
  undefined3 in_register_00000081;
  float fVar2;
  float fVar3;
  float fVar4;
  
  if (CONCAT31(in_register_00000081,flipDiagonally) == 0) {
    fVar1 = this->sWidth;
    if (flipHorizontally) {
      fVar3 = -fVar1;
    }
    else {
      fVar3 = fVar1;
      fVar1 = 0.0;
    }
    fVar4 = this->sHeight;
    fVar2 = fVar4;
    if (!flipVertically) {
      fVar2 = 0.0;
    }
    if (flipVertically) {
      fVar4 = -fVar4;
    }
    Graphics::image(g,this->img,dx,dy,dWidth,dHeight,fVar1 + this->sx,fVar2 + this->sy,fVar3,fVar4);
    return;
  }
  Graphics::push(g);
  Graphics::imageMode(g,CENTER);
  Graphics::translate(g,dWidth * 0.5 + dx,dHeight * 0.5 + dy);
  Graphics::rotate(g,1.5707964);
  fVar1 = this->sWidth;
  if (flipVertically) {
    fVar3 = -fVar1;
  }
  else {
    fVar3 = fVar1;
    fVar1 = 0.0;
  }
  fVar4 = this->sHeight;
  fVar2 = 0.0;
  if (!flipHorizontally) {
    fVar2 = fVar4;
  }
  if (!flipHorizontally) {
    fVar4 = -fVar4;
  }
  Graphics::image(g,this->img,0.0,0.0,dWidth,dHeight,fVar1 + this->sx,fVar2 + this->sy,fVar3,fVar4);
  Graphics::pop(g);
  return;
}

Assistant:

void Sprite::draw(Graphics& g, float dx, float dy, float dWidth, float dHeight, bool flipHorizontally, bool flipVertically, bool flipDiagonally) {
    if (flipDiagonally) {
        g.push();
        g.imageMode(DrawMode::CENTER);
        g.translate(dx + dWidth / 2.0f, dy + dHeight / 2.0f);
        g.rotate(HALF_PI);
        g.image(img, 0, 0, dWidth, dHeight, sx + (flipVertically ? sWidth : 0), sy + (!flipHorizontally ? sHeight : 0), sWidth * (flipVertically ? -1 : 1), sHeight * (!flipHorizontally ? -1 : 1));
        g.pop();
    } else {
        g.image(img, dx, dy, dWidth, dHeight, sx + (flipHorizontally ? sWidth : 0), sy + (flipVertically ? sHeight : 0), sWidth * (flipHorizontally ? -1 : 1), sHeight * (flipVertically ? -1 : 1));
    }
}